

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gs.c
# Opt level: O0

int32 gs_mgau_shortlist(gs_t *gs,int m,int n,float32 *feat,int bst_codeid)

{
  uint uVar1;
  int local_30;
  int local_2c;
  int32 nc;
  int32 bit_id;
  uint32 map;
  int bst_codeid_local;
  float32 *feat_local;
  int n_local;
  int m_local;
  gs_t *gs_local;
  
  local_30 = 0;
  uVar1 = (*gs->codemap[m])[bst_codeid];
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    if ((uVar1 & 1 << ((byte)local_2c & 0x1f)) != 0) {
      gs->mgau_sl[local_30] = local_2c;
      local_30 = local_30 + 1;
    }
  }
  gs->mgau_sl[local_30] = -1;
  if (local_30 == 0) {
    for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
      gs->mgau_sl[local_30] = local_2c;
      local_30 = local_30 + 1;
    }
    gs->mgau_sl[local_30] = -1;
  }
  if (local_30 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x127,"No active gaussian found in senone %d, with num. component = %d\n",
            (ulong)(uint)m,(ulong)(uint)n);
  }
  return local_30;
}

Assistant:

int32
gs_mgau_shortlist(gs_t * gs, int m, int n, float32 * feat, int bst_codeid)
{
    uint32 map;
    int32 bit_id;
    int32 nc;
    nc = 0;

    map = 0;
    map = gs->codemap[m][0][bst_codeid];

#if 0
    E_INFO("The map is %u, the length of gaussian %d\n", map, n);
#endif

    for (bit_id = 0; bit_id < n; bit_id++) {
        if (map & (1 << bit_id))
            gs->mgau_sl[nc++] = bit_id;
    }
    gs->mgau_sl[nc] = -1;

    if (nc == 0) {
        /* 20040222 ARCHAN : added to safe guard Gaussian Selection anomality */
        /* Special case when the number of components is smaller than the max. */
        /* This happens when zero vectors were removed from the codebook. */

        for (bit_id = 0; bit_id < n; bit_id++) {
            gs->mgau_sl[nc++] = bit_id;
        }
        gs->mgau_sl[nc] = -1;
    }

    if (nc == 0) {
        E_INFO
            ("No active gaussian found in senone %d, with num. component = %d\n",
             m, n);
    }
    return nc;

}